

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignumlib.cpp
# Opt level: O1

void __thiscall CVmBigNumCache::release_all(CVmBigNumCache *this)

{
  CVmBigNumCacheReg *pCVar1;
  ulong uVar2;
  
  if (this->max_regs_ != 0) {
    uVar2 = 0;
    do {
      pCVar1 = this->reg_;
      pCVar1[uVar2 & 0xffffffff].nxt_ = this->free_reg_;
      this->free_reg_ = pCVar1 + (uVar2 & 0xffffffff);
      uVar2 = uVar2 + 1;
    } while (uVar2 < this->max_regs_);
  }
  return;
}

Assistant:

void CVmBigNumCache::release_all()
{
    size_t i;

    /* mark each of our registers as not in use */
    for (i = 0 ; i < max_regs_ ; ++i)
        release_reg(i);
}